

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType::MergeFrom(ArrayFeatureType *this,ArrayFeatureType *from)

{
  ArrayFeatureType_ArrayDataType AVar1;
  ShapeFlexibilityCase SVar2;
  DefaultOptionalValueCase DVar3;
  int32 value;
  LogMessage *other;
  ArrayFeatureType_EnumeratedShapes *this_00;
  ArrayFeatureType_EnumeratedShapes *from_00;
  ArrayFeatureType_ShapeRange *this_01;
  ArrayFeatureType_ShapeRange *from_01;
  InternalMetadataWithArenaLite *this_02;
  float value_00;
  double value_01;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  ArrayFeatureType *local_58;
  ArrayFeatureType *from_local;
  ArrayFeatureType *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/FeatureTypes.pb.cc"
               ,0xca2);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_02 = &this->_internal_metadata_;
  this_local = (ArrayFeatureType *)&local_58->_internal_metadata_;
  local_40 = this_02;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_02,&local_20->unknown_fields);
  }
  google::protobuf::RepeatedField<long>::MergeFrom(&this->shape_,&local_58->shape_);
  AVar1 = datatype(local_58);
  if (AVar1 != ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
    AVar1 = datatype(local_58);
    set_datatype(this,AVar1);
  }
  SVar2 = ShapeFlexibility_case(local_58);
  if (SVar2 != SHAPEFLEXIBILITY_NOT_SET) {
    if (SVar2 == kEnumeratedShapes) {
      this_00 = mutable_enumeratedshapes(this);
      from_00 = enumeratedshapes(local_58);
      ArrayFeatureType_EnumeratedShapes::MergeFrom(this_00,from_00);
    }
    else if (SVar2 == kShapeRange) {
      this_01 = mutable_shaperange(this);
      from_01 = shaperange(local_58);
      ArrayFeatureType_ShapeRange::MergeFrom(this_01,from_01);
    }
  }
  DVar3 = defaultOptionalValue_case(local_58);
  if (DVar3 != DEFAULTOPTIONALVALUE_NOT_SET) {
    if (DVar3 == kIntDefaultValue) {
      value = intdefaultvalue(local_58);
      set_intdefaultvalue(this,value);
    }
    else if (DVar3 == kFloatDefaultValue) {
      value_00 = floatdefaultvalue(local_58);
      set_floatdefaultvalue(this,value_00);
    }
    else if (DVar3 == kDoubleDefaultValue) {
      value_01 = doubledefaultvalue(local_58);
      set_doubledefaultvalue(this,value_01);
    }
  }
  return;
}

Assistant:

void ArrayFeatureType::MergeFrom(const ArrayFeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ArrayFeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  shape_.MergeFrom(from.shape_);
  if (from.datatype() != 0) {
    set_datatype(from.datatype());
  }
  switch (from.ShapeFlexibility_case()) {
    case kEnumeratedShapes: {
      mutable_enumeratedshapes()->::CoreML::Specification::ArrayFeatureType_EnumeratedShapes::MergeFrom(from.enumeratedshapes());
      break;
    }
    case kShapeRange: {
      mutable_shaperange()->::CoreML::Specification::ArrayFeatureType_ShapeRange::MergeFrom(from.shaperange());
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (from.defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      set_intdefaultvalue(from.intdefaultvalue());
      break;
    }
    case kFloatDefaultValue: {
      set_floatdefaultvalue(from.floatdefaultvalue());
      break;
    }
    case kDoubleDefaultValue: {
      set_doubledefaultvalue(from.doubledefaultvalue());
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
}